

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void rhash_md5_process_block(uint *state,uint *x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint d;
  uint c;
  uint b;
  uint a;
  uint *x_local;
  uint *state_local;
  
  uVar4 = state[1];
  uVar3 = state[2];
  uVar2 = state[3];
  uVar1 = ((uVar3 ^ uVar2) & uVar4 ^ uVar2) + *x + -0x28955b88 + *state;
  uVar1 = uVar4 + (uVar1 * 0x80 ^ uVar1 >> 0x19);
  uVar2 = ((uVar4 ^ uVar3) & uVar1 ^ uVar3) + x[1] + -0x173848aa + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 ^ uVar2 >> 0x14);
  uVar3 = ((uVar1 ^ uVar4) & uVar2 ^ uVar4) + x[2] + 0x242070db + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 ^ uVar3 >> 0xf);
  uVar4 = ((uVar2 ^ uVar1) & uVar3 ^ uVar1) + x[3] + -0x3e423112 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 ^ uVar4 >> 10);
  uVar1 = ((uVar3 ^ uVar2) & uVar4 ^ uVar2) + x[4] + -0xa83f051 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x80 ^ uVar1 >> 0x19);
  uVar2 = ((uVar4 ^ uVar3) & uVar1 ^ uVar3) + x[5] + 0x4787c62a + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 ^ uVar2 >> 0x14);
  uVar3 = ((uVar1 ^ uVar4) & uVar2 ^ uVar4) + x[6] + -0x57cfb9ed + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 ^ uVar3 >> 0xf);
  uVar4 = ((uVar2 ^ uVar1) & uVar3 ^ uVar1) + x[7] + -0x2b96aff + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 ^ uVar4 >> 10);
  uVar1 = ((uVar3 ^ uVar2) & uVar4 ^ uVar2) + x[8] + 0x698098d8 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x80 ^ uVar1 >> 0x19);
  uVar2 = ((uVar4 ^ uVar3) & uVar1 ^ uVar3) + x[9] + -0x74bb0851 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 ^ uVar2 >> 0x14);
  uVar3 = ((uVar1 ^ uVar4) & uVar2 ^ uVar4) + x[10] + -0xa44f + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 ^ uVar3 >> 0xf);
  uVar4 = ((uVar2 ^ uVar1) & uVar3 ^ uVar1) + x[0xb] + -0x76a32842 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 ^ uVar4 >> 10);
  uVar1 = ((uVar3 ^ uVar2) & uVar4 ^ uVar2) + x[0xc] + 0x6b901122 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x80 ^ uVar1 >> 0x19);
  uVar2 = ((uVar4 ^ uVar3) & uVar1 ^ uVar3) + x[0xd] + -0x2678e6d + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x1000 ^ uVar2 >> 0x14);
  uVar3 = ((uVar1 ^ uVar4) & uVar2 ^ uVar4) + x[0xe] + -0x5986bc72 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x20000 ^ uVar3 >> 0xf);
  uVar4 = ((uVar2 ^ uVar1) & uVar3 ^ uVar1) + x[0xf] + 0x49b40821 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x400000 ^ uVar4 >> 10);
  uVar1 = (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + x[1] + -0x9e1da9e + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 ^ uVar1 >> 0x1b);
  uVar2 = (uVar1 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + x[6] + -0x3fbf4cc0 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 ^ uVar2 >> 0x17);
  uVar3 = (uVar2 & uVar4 | uVar1 & (uVar4 ^ 0xffffffff)) + x[0xb] + 0x265e5a51 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 ^ uVar3 >> 0x12);
  uVar4 = (uVar3 & uVar1 | uVar2 & (uVar1 ^ 0xffffffff)) + *x + -0x16493856 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 ^ uVar4 >> 0xc);
  uVar1 = (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + x[5] + -0x29d0efa3 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 ^ uVar1 >> 0x1b);
  uVar2 = (uVar1 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + x[10] + 0x2441453 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 ^ uVar2 >> 0x17);
  uVar3 = (uVar2 & uVar4 | uVar1 & (uVar4 ^ 0xffffffff)) + x[0xf] + -0x275e197f + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 ^ uVar3 >> 0x12);
  uVar4 = (uVar3 & uVar1 | uVar2 & (uVar1 ^ 0xffffffff)) + x[4] + -0x182c0438 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 ^ uVar4 >> 0xc);
  uVar1 = (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + x[9] + 0x21e1cde6 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 ^ uVar1 >> 0x1b);
  uVar2 = (uVar1 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + x[0xe] + -0x3cc8f82a + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 ^ uVar2 >> 0x17);
  uVar3 = (uVar2 & uVar4 | uVar1 & (uVar4 ^ 0xffffffff)) + x[3] + -0xb2af279 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 ^ uVar3 >> 0x12);
  uVar4 = (uVar3 & uVar1 | uVar2 & (uVar1 ^ 0xffffffff)) + x[8] + 0x455a14ed + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 ^ uVar4 >> 0xc);
  uVar1 = (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + x[0xd] + -0x561c16fb + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x20 ^ uVar1 >> 0x1b);
  uVar2 = (uVar1 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + x[2] + -0x3105c08 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x200 ^ uVar2 >> 0x17);
  uVar3 = (uVar2 & uVar4 | uVar1 & (uVar4 ^ 0xffffffff)) + x[7] + 0x676f02d9 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x4000 ^ uVar3 >> 0x12);
  uVar4 = (uVar3 & uVar1 | uVar2 & (uVar1 ^ 0xffffffff)) + x[0xc] + -0x72d5b376 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x100000 ^ uVar4 >> 0xc);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + x[5] + -0x5c6be + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 ^ uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + x[8] + -0x788e097f + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 ^ uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + x[0xb] + 0x6d9d6122 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 ^ uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + x[0xe] + -0x21ac7f4 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 ^ uVar4 >> 9);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + x[1] + -0x5b4115bc + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 ^ uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + x[4] + 0x4bdecfa9 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 ^ uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + x[7] + -0x944b4a0 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 ^ uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + x[10] + -0x41404390 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 ^ uVar4 >> 9);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + x[0xd] + 0x289b7ec6 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 ^ uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + *x + -0x155ed806 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 ^ uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + x[3] + -0x2b10cf7b + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 ^ uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + x[6] + 0x4881d05 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 ^ uVar4 >> 9);
  uVar1 = (uVar4 ^ uVar3 ^ uVar2) + x[9] + -0x262b2fc7 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x10 ^ uVar1 >> 0x1c);
  uVar2 = (uVar1 ^ uVar4 ^ uVar3) + x[0xc] + -0x1924661b + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x800 ^ uVar2 >> 0x15);
  uVar3 = (uVar2 ^ uVar1 ^ uVar4) + x[0xf] + 0x1fa27cf8 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x10000 ^ uVar3 >> 0x10);
  uVar4 = (uVar3 ^ uVar2 ^ uVar1) + x[2] + -0x3b53a99b + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x800000 ^ uVar4 >> 9);
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *x + -0xbd6ddbc + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x40 ^ uVar1 >> 0x1a);
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + x[7] + 0x432aff97 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x400 ^ uVar2 >> 0x16);
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + x[0xe] + -0x546bdc59 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x8000 ^ uVar3 >> 0x11);
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + x[5] + -0x36c5fc7 + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200000 ^ uVar4 >> 0xb);
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + x[0xc] + 0x655b59c3 + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x40 ^ uVar1 >> 0x1a);
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + x[3] + -0x70f3336e + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x400 ^ uVar2 >> 0x16);
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + x[10] + -0x100b83 + uVar3;
  uVar3 = uVar2 + (uVar3 * 0x8000 ^ uVar3 >> 0x11);
  uVar4 = (uVar2 ^ (uVar3 | uVar1 ^ 0xffffffff)) + x[1] + -0x7a7ba22f + uVar4;
  uVar4 = uVar3 + (uVar4 * 0x200000 ^ uVar4 >> 0xb);
  uVar1 = (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + x[8] + 0x6fa87e4f + uVar1;
  uVar1 = uVar4 + (uVar1 * 0x40 ^ uVar1 >> 0x1a);
  uVar2 = (uVar4 ^ (uVar1 | uVar3 ^ 0xffffffff)) + x[0xf] + -0x1d31920 + uVar2;
  uVar2 = uVar1 + (uVar2 * 0x400 ^ uVar2 >> 0x16);
  uVar3 = (uVar1 ^ (uVar2 | uVar4 ^ 0xffffffff)) + x[6] + -0x5cfebcec + uVar3;
  uVar5 = uVar2 + (uVar3 * 0x8000 ^ uVar3 >> 0x11);
  uVar4 = (uVar2 ^ (uVar5 | uVar1 ^ 0xffffffff)) + x[0xd] + 0x4e0811a1 + uVar4;
  uVar6 = uVar5 + (uVar4 * 0x200000 ^ uVar4 >> 0xb);
  uVar1 = (uVar5 ^ (uVar6 | uVar2 ^ 0xffffffff)) + x[4] + -0x8ac817e + uVar1;
  uVar4 = uVar6 + (uVar1 * 0x40 ^ uVar1 >> 0x1a);
  uVar2 = (uVar6 ^ (uVar4 | uVar5 ^ 0xffffffff)) + x[0xb] + -0x42c50dcb + uVar2;
  uVar3 = uVar4 + (uVar2 * 0x400 ^ uVar2 >> 0x16);
  uVar5 = (uVar4 ^ (uVar3 | uVar6 ^ 0xffffffff)) + x[2] + 0x2ad7d2bb + uVar5;
  uVar2 = uVar3 + (uVar5 * 0x8000 ^ uVar5 >> 0x11);
  uVar6 = (uVar3 ^ (uVar2 | uVar4 ^ 0xffffffff)) + x[9] + -0x14792c6f + uVar6;
  *state = uVar4 + *state;
  state[1] = uVar2 + (uVar6 * 0x200000 ^ uVar6 >> 0xb) + state[1];
  state[2] = uVar2 + state[2];
  state[3] = uVar3 + state[3];
  return;
}

Assistant:

static void rhash_md5_process_block(unsigned state[4], const unsigned* x)
{
	register unsigned a, b, c, d;
	a = state[0];
	b = state[1];
	c = state[2];
	d = state[3];

	MD5_ROUND1(a, b, c, d, x[ 0],  7, 0xd76aa478);
	MD5_ROUND1(d, a, b, c, x[ 1], 12, 0xe8c7b756);
	MD5_ROUND1(c, d, a, b, x[ 2], 17, 0x242070db);
	MD5_ROUND1(b, c, d, a, x[ 3], 22, 0xc1bdceee);
	MD5_ROUND1(a, b, c, d, x[ 4],  7, 0xf57c0faf);
	MD5_ROUND1(d, a, b, c, x[ 5], 12, 0x4787c62a);
	MD5_ROUND1(c, d, a, b, x[ 6], 17, 0xa8304613);
	MD5_ROUND1(b, c, d, a, x[ 7], 22, 0xfd469501);
	MD5_ROUND1(a, b, c, d, x[ 8],  7, 0x698098d8);
	MD5_ROUND1(d, a, b, c, x[ 9], 12, 0x8b44f7af);
	MD5_ROUND1(c, d, a, b, x[10], 17, 0xffff5bb1);
	MD5_ROUND1(b, c, d, a, x[11], 22, 0x895cd7be);
	MD5_ROUND1(a, b, c, d, x[12],  7, 0x6b901122);
	MD5_ROUND1(d, a, b, c, x[13], 12, 0xfd987193);
	MD5_ROUND1(c, d, a, b, x[14], 17, 0xa679438e);
	MD5_ROUND1(b, c, d, a, x[15], 22, 0x49b40821);

	MD5_ROUND2(a, b, c, d, x[ 1],  5, 0xf61e2562);
	MD5_ROUND2(d, a, b, c, x[ 6],  9, 0xc040b340);
	MD5_ROUND2(c, d, a, b, x[11], 14, 0x265e5a51);
	MD5_ROUND2(b, c, d, a, x[ 0], 20, 0xe9b6c7aa);
	MD5_ROUND2(a, b, c, d, x[ 5],  5, 0xd62f105d);
	MD5_ROUND2(d, a, b, c, x[10],  9,  0x2441453);
	MD5_ROUND2(c, d, a, b, x[15], 14, 0xd8a1e681);
	MD5_ROUND2(b, c, d, a, x[ 4], 20, 0xe7d3fbc8);
	MD5_ROUND2(a, b, c, d, x[ 9],  5, 0x21e1cde6);
	MD5_ROUND2(d, a, b, c, x[14],  9, 0xc33707d6);
	MD5_ROUND2(c, d, a, b, x[ 3], 14, 0xf4d50d87);
	MD5_ROUND2(b, c, d, a, x[ 8], 20, 0x455a14ed);
	MD5_ROUND2(a, b, c, d, x[13],  5, 0xa9e3e905);
	MD5_ROUND2(d, a, b, c, x[ 2],  9, 0xfcefa3f8);
	MD5_ROUND2(c, d, a, b, x[ 7], 14, 0x676f02d9);
	MD5_ROUND2(b, c, d, a, x[12], 20, 0x8d2a4c8a);

	MD5_ROUND3(a, b, c, d, x[ 5],  4, 0xfffa3942);
	MD5_ROUND3(d, a, b, c, x[ 8], 11, 0x8771f681);
	MD5_ROUND3(c, d, a, b, x[11], 16, 0x6d9d6122);
	MD5_ROUND3(b, c, d, a, x[14], 23, 0xfde5380c);
	MD5_ROUND3(a, b, c, d, x[ 1],  4, 0xa4beea44);
	MD5_ROUND3(d, a, b, c, x[ 4], 11, 0x4bdecfa9);
	MD5_ROUND3(c, d, a, b, x[ 7], 16, 0xf6bb4b60);
	MD5_ROUND3(b, c, d, a, x[10], 23, 0xbebfbc70);
	MD5_ROUND3(a, b, c, d, x[13],  4, 0x289b7ec6);
	MD5_ROUND3(d, a, b, c, x[ 0], 11, 0xeaa127fa);
	MD5_ROUND3(c, d, a, b, x[ 3], 16, 0xd4ef3085);
	MD5_ROUND3(b, c, d, a, x[ 6], 23,  0x4881d05);
	MD5_ROUND3(a, b, c, d, x[ 9],  4, 0xd9d4d039);
	MD5_ROUND3(d, a, b, c, x[12], 11, 0xe6db99e5);
	MD5_ROUND3(c, d, a, b, x[15], 16, 0x1fa27cf8);
	MD5_ROUND3(b, c, d, a, x[ 2], 23, 0xc4ac5665);

	MD5_ROUND4(a, b, c, d, x[ 0],  6, 0xf4292244);
	MD5_ROUND4(d, a, b, c, x[ 7], 10, 0x432aff97);
	MD5_ROUND4(c, d, a, b, x[14], 15, 0xab9423a7);
	MD5_ROUND4(b, c, d, a, x[ 5], 21, 0xfc93a039);
	MD5_ROUND4(a, b, c, d, x[12],  6, 0x655b59c3);
	MD5_ROUND4(d, a, b, c, x[ 3], 10, 0x8f0ccc92);
	MD5_ROUND4(c, d, a, b, x[10], 15, 0xffeff47d);
	MD5_ROUND4(b, c, d, a, x[ 1], 21, 0x85845dd1);
	MD5_ROUND4(a, b, c, d, x[ 8],  6, 0x6fa87e4f);
	MD5_ROUND4(d, a, b, c, x[15], 10, 0xfe2ce6e0);
	MD5_ROUND4(c, d, a, b, x[ 6], 15, 0xa3014314);
	MD5_ROUND4(b, c, d, a, x[13], 21, 0x4e0811a1);
	MD5_ROUND4(a, b, c, d, x[ 4],  6, 0xf7537e82);
	MD5_ROUND4(d, a, b, c, x[11], 10, 0xbd3af235);
	MD5_ROUND4(c, d, a, b, x[ 2], 15, 0x2ad7d2bb);
	MD5_ROUND4(b, c, d, a, x[ 9], 21, 0xeb86d391);

	state[0] += a;
	state[1] += b;
	state[2] += c;
	state[3] += d;
}